

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_bool(uchar **p,uchar *start,int boolean)

{
  uchar *puVar1;
  int iVar2;
  size_t len;
  int ret;
  int boolean_local;
  uchar *start_local;
  uchar **p_local;
  
  if ((long)*p - (long)start < 1) {
    p_local._4_4_ = -0x6c;
  }
  else {
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = boolean != 0;
    p_local._4_4_ = mbedtls_asn1_write_len(p,start,1);
    if (-1 < p_local._4_4_) {
      iVar2 = p_local._4_4_ + 1;
      p_local._4_4_ = mbedtls_asn1_write_tag(p,start,'\x01');
      if (-1 < p_local._4_4_) {
        p_local._4_4_ = p_local._4_4_ + iVar2;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_bool( unsigned char **p, unsigned char *start, int boolean )
{
    int ret;
    size_t len = 0;

    if( *p - start < 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    *--(*p) = (boolean) ? 1 : 0;
    len++;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_BOOLEAN ) );

    return( (int) len );
}